

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferBufferParameters.cpp
# Opt level: O1

void __thiscall glcts::TextureBufferBufferParameters::deinit(TextureBufferBufferParameters *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar2 + 0x1670))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER);
  (**(code **)(lVar2 + 0x800))();
  this->m_buffer_pointer = (GLubyte *)0x0;
  if (this->m_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferBufferParameters::deinit(void)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.unmapBuffer(m_glExtTokens.TEXTURE_BUFFER);
	gl.getError();
	m_buffer_pointer = DE_NULL;

	/* Delete GLES objects */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);
		m_bo_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}